

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

long BIO_ctrl(BIO *bp,int cmd,long larg,void *parg)

{
  void *parg_local;
  long larg_local;
  int cmd_local;
  BIO *bio_local;
  
  if (bp == (BIO *)0x0) {
    bio_local = (BIO *)0x0;
  }
  else if ((bp->method == (BIO_METHOD *)0x0) || (bp->method->ctrl == (_func_599 *)0x0)) {
    ERR_put_error(0x11,0,0x73,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                  ,0xa9);
    bio_local = (BIO *)0xfffffffffffffffe;
  }
  else {
    bio_local = (BIO *)(*bp->method->ctrl)(bp,cmd,larg,parg);
  }
  return (long)bio_local;
}

Assistant:

long BIO_ctrl(BIO *bio, int cmd, long larg, void *parg) {
  if (bio == NULL) {
    return 0;
  }

  if (bio->method == NULL || bio->method->ctrl == NULL) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNSUPPORTED_METHOD);
    return -2;
  }

  return bio->method->ctrl(bio, cmd, larg, parg);
}